

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O3

void Saig_ManExplorePaths_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int f,int fMax,Vec_Ptr_t *vSimInfo)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  uVar6 = pObj->Id;
  if (-1 < (int)uVar6) {
LAB_005986a2:
    do {
      if (vSimInfo->nSize <= (int)uVar6) break;
      uVar6 = *(uint *)((long)vSimInfo->pArray[uVar6] + (long)(f >> 4) * 4) >>
              ((char)f * '\x02' & 0x1eU);
      if ((uVar6 & 2) != 0) {
        return;
      }
      Saig_ManSetAndDriveImplications_rec(p,pObj,f,fMax,vSimInfo);
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
      }
      uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
      uVar4 = uVar3 & 7;
      lVar2 = 8;
      if (uVar4 != 3) {
        if (uVar4 == 2) goto LAB_0059877f;
        if (uVar4 == 1) {
          __assert_fail("!Aig_ObjIsConst1(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                        ,0x153,
                        "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)"
                       );
        }
        if ((uVar3 & 7) - 7 < 0xfffffffe) {
          __assert_fail("Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                        ,0x16a,
                        "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)"
                       );
        }
        if ((uVar6 & 3) != 2) {
          Saig_ManExplorePaths_rec
                    (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f,fMax,vSimInfo);
          lVar2 = 0x10;
        }
      }
      pObj = (Aig_Obj_t *)(*(ulong *)((long)&pObj->field_0 + lVar2) & 0xfffffffffffffffe);
      uVar6 = pObj->Id;
      if ((int)uVar6 < 0) break;
    } while( true );
  }
LAB_005987db:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
LAB_0059877f:
  uVar6 = (pObj->field_0).CioId;
  iVar5 = p->nTruePis;
  if ((f == 0) && (iVar5 <= (int)uVar6)) {
    return;
  }
  if ((int)uVar6 < iVar5) {
    iVar5 = fMax;
    if (fMax < 0) {
      return;
    }
    goto LAB_00598808;
  }
  if (f < 1) {
    __assert_fail("f > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                  ,0x161,
                  "void Saig_ManExplorePaths_rec(Aig_Man_t *, Aig_Obj_t *, int, int, Vec_Ptr_t *)");
  }
  uVar6 = (uVar6 - iVar5) + p->nTruePos;
  if (((int)uVar6 < 0) || (p->vCos->nSize <= (int)uVar6)) goto LAB_005987db;
  pObj = (Aig_Obj_t *)p->vCos->pArray[uVar6];
  uVar6 = pObj->Id;
  f = f + -1;
  if ((int)uVar6 < 0) goto LAB_005987db;
  goto LAB_005986a2;
LAB_00598808:
  if (f != iVar5) {
    if (((int)uVar6 < 0) || (p->vCis->nSize <= (int)uVar6)) goto LAB_005987db;
    Saig_ManSetAndDriveImplications_rec(p,(Aig_Obj_t *)p->vCis->pArray[uVar6],iVar5,fMax,vSimInfo);
  }
  bVar1 = iVar5 < 1;
  iVar5 = iVar5 + -1;
  if (bVar1) {
    return;
  }
  goto LAB_00598808;
}

Assistant:

void Saig_ManExplorePaths_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int f, int fMax, Vec_Ptr_t * vSimInfo )
{
    int Value = Saig_ManSimInfo2Get( vSimInfo, pObj, f );
    if ( Saig_ManSimInfo2IsOld( Value ) )
        return;
    Saig_ManSetAndDriveImplications_rec( p, pObj, f, fMax, vSimInfo );
    assert( !Aig_ObjIsConst1(pObj) );
    if ( Saig_ObjIsLo(p, pObj) && f == 0 )
        return;
    if ( Saig_ObjIsPi(p, pObj) )
    {
        // propagate implications of this assignment
        int i, iPiNum = Aig_ObjCioId(pObj);
        for ( i = fMax; i >= 0; i-- )
            if ( i != f )
                Saig_ManSetAndDriveImplications_rec( p, Aig_ManCi(p, iPiNum), i, fMax, vSimInfo );
        return;
    }
    if ( Saig_ObjIsLo( p, pObj ) )
    {
        assert( f > 0 );
        Saig_ManExplorePaths_rec( p, Saig_ObjLoToLi(p, pObj), f-1, fMax, vSimInfo );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( Value == SAIG_ZER_OLD )
    {
//        if ( (Aig_ObjId(pObj) & 1) == 0 )
            Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
//        else
//            Saig_ManExplorePaths_rec( p, Aig_ObjFanin1(pObj), f, fMax, vSimInfo );
    }
    else
    {
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin0(pObj), f, fMax, vSimInfo );
        Saig_ManExplorePaths_rec( p, Aig_ObjFanin1(pObj), f, fMax, vSimInfo );
    }
}